

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

u64 __thiscall wabt::interp::Thread::PopPtr(Thread *this,Ptr *table)

{
  bool bVar1;
  u64 uVar2;
  Value VVar3;
  
  bVar1 = (table->obj_->type_).limits.is_64;
  VVar3 = Pop(this);
  uVar2 = VVar3.field_0.i64_;
  if (bVar1 == false) {
    uVar2 = (ulong)VVar3.field_0.i32_;
  }
  return uVar2;
}

Assistant:

Result Extern::MatchImpl(Store& store,
                         const ImportType& import_type,
                         const T& actual,
                         Trap::Ptr* out_trap) {
  const T* extern_type = dyn_cast<T>(import_type.type.get());
  if (!extern_type) {
    *out_trap = Trap::New(
        store,
        StringPrintf("expected import \"%s.%s\" to have kind %s, not %s",
                     import_type.module.c_str(), import_type.name.c_str(),
                     GetName(import_type.type->kind), GetName(T::skind)));
    return Result::Error;
  }

  std::string msg;
  if (Failed(interp::Match(*extern_type, actual, &msg))) {
    *out_trap = Trap::New(store, msg);
    return Result::Error;
  }

  return Result::Ok;
}